

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itemviews.cpp
# Opt level: O1

QAccessibleInterface * __thiscall QAccessibleTable::child(QAccessibleTable *this,int logicalIndex)

{
  Span *pSVar1;
  int iVar2;
  QAbstractItemView *this_00;
  QAbstractItemModel *pQVar3;
  QAccessibleTableCell *this_01;
  QHeaderView *pQVar4;
  QHeaderView *pQVar5;
  undefined8 uVar6;
  Role RVar7;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  long in_FS_OFFSET;
  bool bVar11;
  const_iterator cVar12;
  int copy;
  int local_98 [6];
  char *local_80;
  QModelIndex local_78;
  undefined1 *local_58;
  undefined1 *puStack_50;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_48;
  int local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_3c = logicalIndex;
  (**(code **)(*(long *)&this->super_QAccessibleObject + 0x18))(&this->super_QAccessibleObject);
  this_00 = (QAbstractItemView *)QMetaObject::cast((QObject *)&QAbstractItemView::staticMetaObject);
  if ((this_00 == (QAbstractItemView *)0x0) ||
     (pQVar3 = QAbstractItemView::model(this_00), pQVar3 == (QAbstractItemModel *)0x0)) {
LAB_00533a11:
    this_01 = (QAccessibleTableCell *)0x0;
  }
  else {
    local_48.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
    local_58 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
    QAbstractItemView::rootIndex((QModelIndex *)&local_58,this_00);
    cVar12 = QHash<int,_unsigned_int>::constFindImpl<int>(&this->childToId,&local_3c);
    if (cVar12.i.d != (Data<QHashPrivate::Node<int,_unsigned_int>_> *)0x0 || cVar12.i.bucket != 0) {
      pSVar1 = (cVar12.i.d)->spans;
      uVar8 = cVar12.i.bucket >> 7;
      this_01 = (QAccessibleTableCell *)
                QAccessible::accessibleInterface
                          (*(uint *)(pSVar1[uVar8].entries
                                     [pSVar1[uVar8].offsets[(uint)cVar12.i.bucket & 0x7f]].storage.
                                     data + 4));
      goto LAB_00533a14;
    }
    pQVar4 = verticalHeader(this);
    pQVar5 = horizontalHeader(this);
    this_01 = (QAccessibleTableCell *)0x0;
    iVar2 = (**(code **)(*(long *)pQVar3 + 0x80))(pQVar3,&local_58);
    iVar2 = iVar2 + (uint)(pQVar4 != (QHeaderView *)0x0);
    iVar9 = local_3c / iVar2;
    uVar8 = (long)local_3c % (long)iVar2;
    uVar10 = uVar8 & 0xffffffff;
    iVar2 = (int)uVar8;
    if (pQVar4 != (QHeaderView *)0x0) {
      if (iVar2 == 0) {
        if ((pQVar5 == (QHeaderView *)0x0) || (iVar9 != 0)) {
          this_01 = (QAccessibleTableCell *)operator_new(0x20);
          *(undefined ***)this_01 = &PTR__QAccessibleTableHeaderCell_00818630;
          uVar6 = QtSharedPointer::ExternalRefCountData::getAndRef((QObject *)this_00);
          *(undefined8 *)&this_01->super_QAccessibleTableCellInterface = uVar6;
          *(QAbstractItemView **)&this_01->super_QAccessibleActionInterface = this_00;
          *(uint *)&(this_01->view).wp.d = iVar9 - (uint)(pQVar5 != (QHeaderView *)0x0);
          *(undefined4 *)((long)&(this_01->view).wp.d + 4) = 2;
        }
        else {
          this_01 = (QAccessibleTableCell *)operator_new(0x18);
          *(undefined ***)this_01 = &PTR__QAccessibleTableCornerButton_00818ca0;
          uVar6 = QtSharedPointer::ExternalRefCountData::getAndRef((QObject *)this_00);
          *(undefined8 *)&this_01->super_QAccessibleTableCellInterface = uVar6;
          *(QAbstractItemView **)&this_01->super_QAccessibleActionInterface = this_00;
        }
      }
      else {
        this_01 = (QAccessibleTableCell *)0x0;
      }
      uVar10 = (ulong)(iVar2 - 1);
    }
    if (this_01 == (QAccessibleTableCell *)0x0 && pQVar5 != (QHeaderView *)0x0) {
      if (iVar9 == 0) {
        this_01 = (QAccessibleTableCell *)operator_new(0x20);
        *(undefined ***)this_01 = &PTR__QAccessibleTableHeaderCell_00818630;
        uVar6 = QtSharedPointer::ExternalRefCountData::getAndRef((QObject *)this_00);
        *(undefined8 *)&this_01->super_QAccessibleTableCellInterface = uVar6;
        *(QAbstractItemView **)&this_01->super_QAccessibleActionInterface = this_00;
        *(int *)&(this_01->view).wp.d = (int)uVar10;
        *(undefined4 *)((long)&(this_01->view).wp.d + 4) = 1;
      }
      else {
        this_01 = (QAccessibleTableCell *)0x0;
      }
      iVar9 = iVar9 + -1;
    }
    if (this_01 == (QAccessibleTableCell *)0x0) {
      local_78.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
      local_78.r = -0x55555556;
      local_78.c = -0x55555556;
      local_78.i._0_4_ = 0xaaaaaaaa;
      local_78.i._4_4_ = 0xaaaaaaaa;
      (**(code **)(*(long *)pQVar3 + 0x60))(&local_78);
      bVar11 = false;
      if ((-1 < local_78.r) && (bVar11 = false, -1 < local_78.c)) {
        bVar11 = local_78.m.ptr != (QAbstractItemModel *)0x0;
      }
      if (bVar11) {
        this_01 = (QAccessibleTableCell *)operator_new(0x38);
        RVar7 = this->m_role;
        if (RVar7 == Tree) {
          RVar7 = TreeItem;
        }
        else if (RVar7 == List) {
          RVar7 = ListItem;
        }
        else if (RVar7 == Table) {
          RVar7 = Cell;
        }
        else {
          RVar7 = NoRole;
        }
        QAccessibleTableCell::QAccessibleTableCell
                  (this_01,(QAbstractItemView *)this_00,&local_78,RVar7);
      }
      else {
        local_98[0] = 2;
        local_98[1] = 0;
        local_98[2] = 0;
        local_98[3] = 0;
        local_98[4] = 0;
        local_98[5] = 0;
        local_80 = "default";
        this_01 = (QAccessibleTableCell *)0x0;
        QMessageLogger::warning
                  ((char *)local_98,"QAccessibleTable::child: Invalid index at: %d %d",iVar9,uVar10)
        ;
      }
      if (!bVar11) goto LAB_00533a11;
    }
    QAccessible::registerAccessibleInterface(&this_01->super_QAccessibleInterface);
    local_78.r = QAccessible::uniqueId(&this_01->super_QAccessibleInterface);
    local_98[0] = local_3c;
    QHash<int,unsigned_int>::emplace<unsigned_int_const&>
              ((QHash<int,unsigned_int> *)&this->childToId,local_98,(uint *)&local_78);
  }
LAB_00533a14:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return &this_01->super_QAccessibleInterface;
}

Assistant:

QAccessibleInterface *QAccessibleTable::child(int logicalIndex) const
{
    QAbstractItemView *theView = view();
    if (!theView)
        return nullptr;

    const QAbstractItemModel *theModel = theView->model();
    if (!theModel)
        return nullptr;

    const QModelIndex rootIndex = theView->rootIndex();
    auto id = childToId.constFind(logicalIndex);
    if (id != childToId.constEnd())
        return QAccessible::accessibleInterface(id.value());

    int vHeader = verticalHeader() ? 1 : 0;
    int hHeader = horizontalHeader() ? 1 : 0;

    int columns = theModel->columnCount(rootIndex) + vHeader;

    int row = logicalIndex / columns;
    int column = logicalIndex % columns;

    QAccessibleInterface *iface = nullptr;

    if (vHeader) {
        if (column == 0) {
            if (hHeader && row == 0) {
                iface = new QAccessibleTableCornerButton(theView);
            } else {
                iface = new QAccessibleTableHeaderCell(theView, row - hHeader, Qt::Vertical);
            }
        }
        --column;
    }
    if (!iface && hHeader) {
        if (row == 0) {
            iface = new QAccessibleTableHeaderCell(theView, column, Qt::Horizontal);
        }
        --row;
    }

    if (!iface) {
        QModelIndex index = theModel->index(row, column, rootIndex);
        if (Q_UNLIKELY(!index.isValid())) {
            qWarning("QAccessibleTable::child: Invalid index at: %d %d", row, column);
            return nullptr;
        }
        iface = new QAccessibleTableCell(theView, index, cellRole());
    }

    QAccessible::registerAccessibleInterface(iface);
    childToId.insert(logicalIndex, QAccessible::uniqueId(iface));
    return iface;
}